

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void mbedtls_xor(uchar *r,uchar *a,uchar *b,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (n < 8) {
    uVar1 = 0;
  }
  else {
    uVar2 = 0;
    do {
      *(ulong *)(r + uVar2) = *(ulong *)(b + uVar2) ^ *(ulong *)(a + uVar2);
      uVar1 = uVar2 + 8;
      uVar3 = uVar2 + 0x10;
      uVar2 = uVar1;
    } while (uVar3 <= n);
  }
  if (uVar1 < n) {
    do {
      r[uVar1] = b[uVar1] ^ a[uVar1];
      uVar1 = uVar1 + 1;
    } while (n != uVar1);
  }
  return;
}

Assistant:

inline void mbedtls_xor(unsigned char *r, const unsigned char *a, const unsigned char *b, size_t n)
{
    size_t i = 0;
#if defined(MBEDTLS_EFFICIENT_UNALIGNED_ACCESS)
#if defined(__ARM_NEON)
    for (; (i + 16) <= n; i += 16) {
        uint8x16_t v1 = vld1q_u8(a + i);
        uint8x16_t v2 = vld1q_u8(b + i);
        uint8x16_t x = veorq_u8(v1, v2);
        vst1q_u8(r + i, x);
    }
#elif defined(__amd64__) || defined(__x86_64__) || defined(__aarch64__)
    /* This codepath probably only makes sense on architectures with 64-bit registers */
    for (; (i + 8) <= n; i += 8) {
        uint64_t x = mbedtls_get_unaligned_uint64(a + i) ^ mbedtls_get_unaligned_uint64(b + i);
        mbedtls_put_unaligned_uint64(r + i, x);
    }
#else
    for (; (i + 4) <= n; i += 4) {
        uint32_t x = mbedtls_get_unaligned_uint32(a + i) ^ mbedtls_get_unaligned_uint32(b + i);
        mbedtls_put_unaligned_uint32(r + i, x);
    }
#endif
#endif
    for (; i < n; i++) {
        r[i] = a[i] ^ b[i];
    }
}